

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_send_multiple_jobs_starting_with_close(void)

{
  _Bool _Var1;
  cio_error cVar2;
  ulong actual;
  cio_write_buffer wb;
  cio_write_buffer local_108;
  cio_write_buffer pong_wbh;
  cio_write_buffer ping_wbh;
  char buffer [125];
  
  wb.data.head.q_len = (size_t)buffer;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x70] = '\0';
  buffer[0x71] = '\0';
  buffer[0x72] = '\0';
  buffer[0x73] = '\0';
  buffer[0x74] = '\0';
  buffer[0x75] = '\0';
  buffer[0x76] = '\0';
  buffer[0x77] = '\0';
  buffer[0x78] = '\0';
  buffer[0x79] = '\0';
  buffer[0x7a] = '\0';
  buffer[0x7b] = '\0';
  buffer[0x7c] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  buffer[100] = '\0';
  buffer[0x65] = '\0';
  buffer[0x66] = '\0';
  buffer[0x67] = '\0';
  buffer[0x68] = '\0';
  buffer[0x69] = '\0';
  buffer[0x6a] = '\0';
  buffer[0x6b] = '\0';
  buffer[0x6c] = '\0';
  buffer[0x6d] = '\0';
  buffer[0x6e] = '\0';
  buffer[0x6f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = 'a';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  cio_buffered_stream_write_fake.custom_fake = bs_write_later;
  ping_wbh.data.head.q_len = 0;
  ping_wbh.data.element.length = 0;
  pong_wbh.data.head.q_len = 0;
  pong_wbh.data.element.length = 0;
  local_108.next = &wb;
  wb.data.element.length = 0x7d;
  local_108.data.head.q_len = 1;
  local_108.data.element.length = 0x7d;
  wb.next = &local_108;
  wb.prev = &local_108;
  local_108.prev = local_108.next;
  pong_wbh.next = &pong_wbh;
  pong_wbh.prev = &pong_wbh;
  ping_wbh.next = &ping_wbh;
  ping_wbh.prev = &ping_wbh;
  cVar2 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a close frame did not succeed!",0xb16,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_ping(ws,&ping_wbh,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a ping frame did not succeed!",0xb18,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_pong(ws,&pong_wbh,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a pong frame did not succeed!",0xb1a,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_message_first_chunk
                    (ws,local_108.data.element.length,&local_108,true,false,write_handler,
                     (void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a text frame did not succeed!",0xb1c,UNITY_DISPLAY_STYLE_INT);
  cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
  bs_write_ok(write_later_bs,write_later_buf,write_later_handler,write_later_handler_context);
  UnityAssertEqualNumber
            (4,(ulong)write_handler_fake.call_count,"Write handler was not called",0xb22,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[0],
             "websocket parameter of write_handler not correct",0xb23,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[0] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb24);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_history[3],"err parameter of write_handler not correct"
             ,0xb25,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[1],
             "websocket parameter of write_handler not correct",0xb26,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[1] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb27);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[0],
             "err parameter of write_handler not correct",0xb28,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[2],
             "websocket parameter of write_handler not correct",0xb29,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0xb2a);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[1],
             "err parameter of write_handler not correct",0xb2b,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[3],
             "websocket parameter of write_handler not correct",0xb2c,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[3] == (void *)0x0) {
    UnityAssertEqualNumber
              (-0x7d,(long)write_handler_fake.arg2_history[2],
               "err parameter of write_handler not correct",0xb2e,UNITY_DISPLAY_STYLE_INT);
    actual = (ulong)on_error_fake.call_count;
    UnityAssertEqualNumber(0,actual,"error callback was called",0xb30,UNITY_DISPLAY_STYLE_INT);
    _Var1 = is_close_frame(1000,SUB81(actual,0));
    if (_Var1) {
      return;
    }
    UnityFail("Written close frame not correct",0xb32);
  }
  UnityFail("context parameter of write_handler not NULL",0xb2d);
}

Assistant:

static void test_send_multiple_jobs_starting_with_close(void)
{
	char buffer[125] = {'a'};

	cio_buffered_stream_write_fake.custom_fake = bs_write_later;

	struct cio_write_buffer ping_wbh;
	cio_write_buffer_head_init(&ping_wbh);
	struct cio_write_buffer pong_wbh;
	cio_write_buffer_head_init(&pong_wbh);
	struct cio_write_buffer text_wbh;
	cio_write_buffer_head_init(&text_wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&text_wbh, &wb);

	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a close frame did not succeed!");
	err = cio_websocket_write_ping(ws, &ping_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	err = cio_websocket_write_pong(ws, &pong_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a pong frame did not succeed!");
	err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&text_wbh), &text_wbh, true, false, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");

	// Simulate write call over the eventloop
	cio_buffered_stream_write_fake.custom_fake = bs_write_ok;
	bs_write_ok(write_later_bs, write_later_buf, write_later_handler, write_later_handler_context);

	TEST_ASSERT_EQUAL_MESSAGE(4, write_handler_fake.call_count, "Write handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[0], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[0], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_history[3], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[1], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[1], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[0], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[2], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[2], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[1], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[3], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[3], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[2], "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_TRUE_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_NORMAL, true), "Written close frame not correct");
}